

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

StringRef __thiscall mp::NameProvider::name(NameProvider *this,size_t index,size_t i2)

{
  pointer ppcVar1;
  char *pcVar2;
  Buffer<char> *pBVar3;
  pointer pcVar4;
  ulong __n;
  char *pcVar5;
  size_t sVar6;
  char *str;
  size_t new_size_1;
  size_t new_size;
  ulong uVar8;
  StringRef SVar9;
  char *pcVar7;
  
  uVar8 = index + 1;
  ppcVar1 = (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar8 < (ulong)((long)(this->names_).
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3)) {
    pcVar5 = ppcVar1[index];
    pcVar2 = ppcVar1[index + 1];
    pcVar7 = pcVar2 + -1;
    if ((pcVar5 < pcVar7) && (pcVar2[-2] == '\r')) {
      pcVar7 = pcVar2 + -2;
    }
    sVar6 = (long)pcVar7 - (long)pcVar5;
  }
  else {
    pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
    pBVar3->size_ = 0;
    if (index < i2) {
      pcVar4 = (this->gen_name_)._M_dataplus._M_p;
      __n = (this->gen_name_)._M_string_length;
      if (pBVar3->capacity_ < __n) {
        (**pBVar3->_vptr_Buffer)(pBVar3,__n);
      }
      if (__n != 0) {
        memmove(pBVar3->ptr_ + pBVar3->size_,pcVar4,__n);
      }
      pBVar3->size_ = __n;
      pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
      if (pBVar3->size_ == pBVar3->capacity_) {
        (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
      }
      sVar6 = pBVar3->size_;
      pBVar3->size_ = sVar6 + 1;
      pBVar3->ptr_[sVar6] = '[';
    }
    else {
      pcVar4 = (this->gen_name_2_)._M_dataplus._M_p;
      uVar8 = (this->gen_name_2_)._M_string_length;
      if (pBVar3->capacity_ < uVar8) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar8);
      }
      if (uVar8 != 0) {
        memmove(pBVar3->ptr_ + pBVar3->size_,pcVar4,uVar8);
      }
      pBVar3->size_ = uVar8;
      pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
      if (pBVar3->size_ == pBVar3->capacity_) {
        (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
      }
      sVar6 = pBVar3->size_;
      pBVar3->size_ = sVar6 + 1;
      pBVar3->ptr_[sVar6] = '[';
      uVar8 = (index - i2) + 1;
    }
    fmt::BasicWriter<char>::
    write_int<unsigned_long,fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
              (&(this->writer_).super_BasicWriter<char>,uVar8,
               (IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char>)uVar8);
    pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
    if (pBVar3->size_ == pBVar3->capacity_) {
      (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
    }
    sVar6 = pBVar3->size_;
    pBVar3->size_ = sVar6 + 1;
    pBVar3->ptr_[sVar6] = ']';
    pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
    sVar6 = pBVar3->size_;
    if (pBVar3->capacity_ < sVar6 + 1) {
      (**pBVar3->_vptr_Buffer)();
    }
    ((this->writer_).super_BasicWriter<char>.buffer_)->ptr_[sVar6] = '\0';
    pBVar3 = (this->writer_).super_BasicWriter<char>.buffer_;
    pcVar5 = pBVar3->ptr_;
    sVar6 = pBVar3->size_;
  }
  SVar9.size_ = sVar6;
  SVar9.data_ = pcVar5;
  return SVar9;
}

Assistant:

fmt::StringRef mp::NameProvider::name(
    std::size_t index, std::size_t i2) {
  if (index + 1 < names_.size()) {
    const char *name = names_[index];
    const auto* pos1past = names_[index + 1] - 1;
    assert( ('\n' == *pos1past) || ('\r' == *pos1past));
    if (pos1past>name && '\r' == *(pos1past-1))            // Windows
      --pos1past;
    return fmt::StringRef(name, pos1past - name);
  }
  writer_.clear();
  if (index>=i2)
    writer_ << gen_name_2_ << '[' << (index - i2 + 1) << ']';
  else
    writer_ << gen_name_ << '[' << (index + 1) << ']';
  return fmt::StringRef(writer_.c_str(), writer_.size());
}